

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderTessellationMaxInOut::retrieveGLConstantValues
          (TessellationShaderTessellationMaxInOut *this)

{
  GLint *value;
  GLint *value_00;
  GLint *value_01;
  GLint *value_02;
  ostringstream *poVar1;
  GLint *value_03;
  GLint *value_04;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  MessageBuilder *pMVar5;
  NotSupportedError *pNVar6;
  allocator<char> local_1c1;
  GLint *local_1c0;
  GLint *local_1b8;
  undefined1 local_1b0 [384];
  long lVar4;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  local_1b8 = &this->m_gl_max_vertex_output_components_value;
  (**(code **)(lVar4 + 0x868))(0x9122);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() failed for GL_MAX_VERTEX_OUTPUT_COMPONENTS pname!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xac7);
  local_1c0 = &this->m_gl_max_tess_control_input_components_value;
  (**(code **)(lVar4 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_CONTROL_INPUT_COMPONENTS);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() failed for GL_MAX_TESS_CONTROL_INPUT_COMPONENTS_EXT pname!"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xaca);
  value = &this->m_gl_max_tess_control_output_components_value;
  (**(code **)(lVar4 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_CONTROL_OUTPUT_COMPONENTS,value);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,
                  "glGetIntegerv() failed for GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS_EXT pname!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xacd);
  (**(code **)(lVar4 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_PATCH_COMPONENTS,
             &this->m_gl_max_tess_patch_components_value);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() failed for GL_MAX_TESS_PATCH_COMPONENTS_EXT pname!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xad0);
  value_00 = &this->m_gl_max_tess_evaluation_input_components_value;
  (**(code **)(lVar4 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_EVALUATION_INPUT_COMPONENTS,value_00)
  ;
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,
                  "glGetIntegerv() failed for GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS_EXT pname!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xad4);
  value_01 = &this->m_gl_max_tess_evaluation_output_components_value;
  (**(code **)(lVar4 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_EVALUATION_OUTPUT_COMPONENTS,value_01
            );
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,
                  "glGetIntegerv() failed for GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS_EXT pname!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xad9);
  value_02 = &this->m_gl_max_transform_feedback_interleaved_components_value;
  (**(code **)(lVar4 + 0x868))(0x8c8a,value_02);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,
                  "glGetIntegerv() failed for GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS pname!"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xade);
  value_04 = local_1b8;
  value_03 = local_1c0;
  if (this->m_gl_max_vertex_output_components_value <
      this->m_gl_max_tess_control_input_components_value) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Warning: GL_MAX_VERTEX_OUTPUT_COMPONENTS value:");
    pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value_04);
    std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    " is less than GL_MAX_TESS_CONTROL_INPUT_COMPONENTS_EXT: ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,value_03);
    std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    ". It may not be possible to pass all GL_MAX_TESS_CONTROL_INPUT_COMPONENTS_EXT per-vertex components from Vertex Shader to Tessellation Control Shader."
                   );
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,
               "GL_MAX_VERTEX_OUTPUT_COMPONENTS < GL_MAX_TESS_CONTROL_INPUT_COMPONENTS",&local_1c1);
    tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_1b0);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (*value == *value_00) {
    if (*value_01 <= *value_02) {
      return;
    }
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Warning: GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS_EXT:");
    pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value_01);
    std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    " is greater than GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS:");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,value_02);
    std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    ". It may not be possible to check all GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS_EXT per-vertex components from Tessellation Evaluation Shader."
                   );
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,
               "GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS > GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS"
               ,&local_1c1);
    tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_1b0);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Warning: GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS_EXT:");
  pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
  std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  " is not equal to GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS_EXT:");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,value_00);
  std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  ". It may not be possible to pass all GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS_EXT per-vertex components from Tessellation Control Shader to Tessellation Evaluation Shader."
                 );
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,
             "GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS != GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS",
             &local_1c1);
  tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_1b0);
  __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderTessellationMaxInOut::retrieveGLConstantValues(void)
{
	/* Retrieve ES entry-points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Query implementation constants */
	gl.getIntegerv(GL_MAX_VERTEX_OUTPUT_COMPONENTS, &m_gl_max_vertex_output_components_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_VERTEX_OUTPUT_COMPONENTS pname!");

	gl.getIntegerv(m_glExtTokens.MAX_TESS_CONTROL_INPUT_COMPONENTS, &m_gl_max_tess_control_input_components_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_CONTROL_INPUT_COMPONENTS_EXT pname!");

	gl.getIntegerv(m_glExtTokens.MAX_TESS_CONTROL_OUTPUT_COMPONENTS, &m_gl_max_tess_control_output_components_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS_EXT pname!");

	gl.getIntegerv(m_glExtTokens.MAX_TESS_PATCH_COMPONENTS, &m_gl_max_tess_patch_components_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_PATCH_COMPONENTS_EXT pname!");

	gl.getIntegerv(m_glExtTokens.MAX_TESS_EVALUATION_INPUT_COMPONENTS,
				   &m_gl_max_tess_evaluation_input_components_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS_EXT pname!");

	gl.getIntegerv(m_glExtTokens.MAX_TESS_EVALUATION_OUTPUT_COMPONENTS,
				   &m_gl_max_tess_evaluation_output_components_value);
	GLU_EXPECT_NO_ERROR(gl.getError(),
						"glGetIntegerv() failed for GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS_EXT pname!");

	gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS,
				   &m_gl_max_transform_feedback_interleaved_components_value);
	GLU_EXPECT_NO_ERROR(gl.getError(),
						"glGetIntegerv() failed for GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS pname!");

	/* Sanity checks */
	DE_ASSERT(m_gl_max_vertex_output_components_value != 0);
	DE_ASSERT(m_gl_max_tess_control_input_components_value != 0);
	DE_ASSERT(m_gl_max_tess_control_output_components_value != 0);
	DE_ASSERT(m_gl_max_tess_patch_components_value != 0);
	DE_ASSERT(m_gl_max_tess_evaluation_input_components_value != 0);
	DE_ASSERT(m_gl_max_tess_evaluation_output_components_value != 0);
	DE_ASSERT(m_gl_max_transform_feedback_interleaved_components_value != 0);

	/* Make sure it is possible to transfer all components through all the stages.
	 * If not, the test may fail, so we throw not supported. */
	if (m_gl_max_vertex_output_components_value < m_gl_max_tess_control_input_components_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Warning: GL_MAX_VERTEX_OUTPUT_COMPONENTS value:"
						   << m_gl_max_vertex_output_components_value
						   << " is less than GL_MAX_TESS_CONTROL_INPUT_COMPONENTS_EXT: "
						   << m_gl_max_tess_control_input_components_value
						   << ". It may not be possible to pass all GL_MAX_TESS_CONTROL_INPUT_COMPONENTS_EXT "
							  "per-vertex components from Vertex Shader to Tessellation Control Shader."
						   << tcu::TestLog::EndMessage;
		throw tcu::NotSupportedError("GL_MAX_VERTEX_OUTPUT_COMPONENTS < GL_MAX_TESS_CONTROL_INPUT_COMPONENTS");
	}

	if (m_gl_max_tess_control_output_components_value != m_gl_max_tess_evaluation_input_components_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Warning: GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS_EXT:"
						   << m_gl_max_tess_control_output_components_value
						   << " is not equal to GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS_EXT:"
						   << m_gl_max_tess_evaluation_input_components_value
						   << ". It may not be possible to pass all GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS_EXT "
							  "per-vertex components from Tessellation Control Shader to Tessellation "
							  "Evaluation Shader."
						   << tcu::TestLog::EndMessage;
		throw tcu::NotSupportedError("GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS != "
									 "GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS");
	}

	if (m_gl_max_tess_evaluation_output_components_value > m_gl_max_transform_feedback_interleaved_components_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Warning: GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS_EXT:"
						   << m_gl_max_tess_evaluation_output_components_value
						   << " is greater than GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS:"
						   << m_gl_max_transform_feedback_interleaved_components_value
						   << ". It may not be possible to check all GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS_EXT "
							  "per-vertex components from Tessellation Evaluation Shader."
						   << tcu::TestLog::EndMessage;
		throw tcu::NotSupportedError("GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS > "
									 "GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS");
	}
}